

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int Curl_conncache_init(conncache *connc,int size)

{
  CURL *pCVar1;
  int rc;
  int size_local;
  conncache *connc_local;
  
  pCVar1 = curl_easy_init();
  connc->closure_handle = pCVar1;
  if (connc->closure_handle == (Curl_easy *)0x0) {
    connc_local._4_4_ = 1;
  }
  else {
    connc_local._4_4_ =
         Curl_hash_init(&connc->hash,size,Curl_hash_str,Curl_str_key_compare,free_bundle_hash_entry)
    ;
    if (connc_local._4_4_ == 0) {
      (connc->closure_handle->state).conn_cache = connc;
    }
    else {
      Curl_close(connc->closure_handle);
      connc->closure_handle = (Curl_easy *)0x0;
    }
  }
  return connc_local._4_4_;
}

Assistant:

int Curl_conncache_init(struct conncache *connc, int size)
{
  int rc;

  /* allocate a new easy handle to use when closing cached connections */
  connc->closure_handle = curl_easy_init();
  if(!connc->closure_handle)
    return 1; /* bad */

  rc = Curl_hash_init(&connc->hash, size, Curl_hash_str,
                      Curl_str_key_compare, free_bundle_hash_entry);
  if(rc) {
    Curl_close(connc->closure_handle);
    connc->closure_handle = NULL;
  }
  else
    connc->closure_handle->state.conn_cache = connc;

  return rc;
}